

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O0

CURLcode ftp_perform(connectdata *conn,_Bool *connected,_Bool *dophase_done)

{
  FTP *ftp;
  CURLcode result;
  _Bool *dophase_done_local;
  _Bool *connected_local;
  connectdata *conn_local;
  
  if ((*(ulong *)&(conn->data->set).field_0x878 >> 0x1c & 1) != 0) {
    *(undefined4 *)((long)(conn->data->req).protop + 0x20) = 1;
  }
  *dophase_done = false;
  conn_local._4_4_ = ftp_state_quote(conn,true,FTP_QUOTE);
  if (conn_local._4_4_ == CURLE_OK) {
    conn_local._4_4_ = ftp_multi_statemach(conn,dophase_done);
    *connected = (_Bool)((conn->bits).tcpconnect[1] & 1);
    Curl_infof(conn->data,"ftp_perform ends with SECONDARY: %d\n",(ulong)(*connected & 1));
  }
  return conn_local._4_4_;
}

Assistant:

static
CURLcode ftp_perform(struct connectdata *conn,
                     bool *connected,  /* connect status after PASV / PORT */
                     bool *dophase_done)
{
  /* this is FTP and no proxy */
  CURLcode result = CURLE_OK;

  DEBUGF(infof(conn->data, "DO phase starts\n"));

  if(conn->data->set.opt_no_body) {
    /* requested no body means no transfer... */
    struct FTP *ftp = conn->data->req.protop;
    ftp->transfer = FTPTRANSFER_INFO;
  }

  *dophase_done = FALSE; /* not done yet */

  /* start the first command in the DO phase */
  result = ftp_state_quote(conn, TRUE, FTP_QUOTE);
  if(result)
    return result;

  /* run the state-machine */
  result = ftp_multi_statemach(conn, dophase_done);

  *connected = conn->bits.tcpconnect[SECONDARYSOCKET];

  infof(conn->data, "ftp_perform ends with SECONDARY: %d\n", *connected);

  if(*dophase_done) {
    DEBUGF(infof(conn->data, "DO phase is complete1\n"));
  }

  return result;
}